

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

unsigned_long * __thiscall
google::protobuf::RepeatedField<unsigned_long>::at(RepeatedField<unsigned_long> *this,int index)

{
  LogMessage *pLVar1;
  unsigned_long *puVar2;
  LogFinisher local_a2;
  byte local_a1;
  LogMessage local_a0;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  int local_14;
  RepeatedField<unsigned_long> *pRStack_10;
  int index_local;
  RepeatedField<unsigned_long> *this_local;
  
  local_51 = 0;
  local_14 = index;
  pRStack_10 = this;
  if (index < 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x28d);
    local_51 = 1;
    pLVar1 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (index) >= (0): ");
    internal::LogFinisher::operator=(local_65,pLVar1);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  local_a1 = 0;
  if (this->current_size_ <= local_14) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x28e);
    local_a1 = 1;
    pLVar1 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (index) < (current_size_): ")
    ;
    internal::LogFinisher::operator=(&local_a2,pLVar1);
  }
  if ((local_a1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_a0);
  }
  puVar2 = elements(this);
  return puVar2 + local_14;
}

Assistant:

inline Element& RepeatedField<Element>::at(int index) {
  GOOGLE_CHECK_GE(index, 0);
  GOOGLE_CHECK_LT(index, current_size_);
  return elements()[index];
}